

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set_partition_iterator.h
# Opt level: O3

void __thiscall
Gudhi::coxeter_triangulation::Set_partition_iterator::increment(Set_partition_iterator *this)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  pointer pvVar1;
  long lVar2;
  iterator __position;
  pointer puVar3;
  pointer puVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 uStack_18;
  
  if (1 < this->k_) {
    puVar3 = (this->rgs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (this->max_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = this->n_ + 2;
    do {
      do {
        uVar5 = uVar6;
        uVar8 = uVar5 - 3;
        uVar9 = puVar3[uVar8] + 1;
        uVar6 = uVar5 - 1;
      } while (this->k_ <= uVar9);
    } while (puVar4[uVar8] < uVar9);
    if (uVar6 != 2) {
      uVar5 = uVar5 - 2;
      puVar3[uVar8] = uVar9;
      uVar8 = (puVar4[uVar8] + 1) - (uint)(uVar9 < puVar4[uVar8]);
      uVar10 = (ulong)uVar5;
      puVar4[uVar10] = uVar8;
      if (uVar5 < this->n_) {
        do {
          uVar5 = uVar6;
          puVar3[uVar10] = 0;
          puVar4[uVar5] = uVar8;
          uVar10 = uVar10 + 1;
          uVar6 = uVar5 + 1;
        } while (uVar10 < this->n_);
      }
      uVar10 = (ulong)uVar5;
      uVar6 = this->k_;
      if (uVar6 <= uVar8) {
        uVar6 = this->k_;
        if ((ulong)uVar6 != 0) {
          pvVar1 = (this->value_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar7 = 0;
          do {
            lVar2 = *(long *)((long)&(pvVar1->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl + lVar7);
            if (*(long *)((long)&(pvVar1->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl + lVar7 + 8) != lVar2) {
              *(long *)((long)&(pvVar1->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl + lVar7 + 8) = lVar2;
            }
            lVar7 = lVar7 + 0x18;
          } while ((ulong)uVar6 * 0x18 != lVar7);
        }
        uStack_18 = (ulong)puVar3 & 0xffffffff;
        if (this->n_ != 0) {
          uVar6 = 0;
          do {
            this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                      ((this->value_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                      (this->rgs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar6]);
            __position._M_current = *(uint **)(this_00 + 8);
            if (__position._M_current == *(uint **)(this_00 + 0x10)) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        (this_00,__position,(uint *)((long)&uStack_18 + 4));
            }
            else {
              *__position._M_current = uVar6;
              *(uint **)(this_00 + 8) = __position._M_current + 1;
            }
            uVar6 = uStack_18._4_4_ + 1;
            uStack_18 = CONCAT44(uVar6,(undefined4)uStack_18);
          } while (uVar6 < this->n_);
        }
        return;
      }
      do {
        puVar4[uVar10] = uVar6;
        uVar10 = (ulong)((int)uVar10 - 1);
        uVar6 = uVar6 - 1;
        puVar3[uVar10] = uVar6;
      } while (puVar4[uVar10] < uVar6);
      update_value(this);
      return;
    }
  }
  this->is_end_ = true;
  return;
}

Assistant:

void increment() {
    if (k_ <= 1) {
      is_end_ = true;
      return;
    }
    uint i = n_ - 1;
    while (rgs_[i] + 1 > max_[i] || rgs_[i] + 1 >= k_) i--;
    if (i == 0) {
      is_end_ = true;
      return;
    }
    rgs_[i]++;
    uint mm = max_[i];
    mm += (rgs_[i] >= mm);
    max_[i + 1] = mm;
    while (++i < n_) {
      rgs_[i] = 0;
      max_[i + 1] = mm;
    }
    uint p = k_;
    if (mm < p) do {
        max_[i] = p;
        --i;
        --p;
        rgs_[i] = p;
      } while (max_[i] < p);
    update_value();
  }